

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void reportBadObjLib(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *badObjLib,
                    cmGeneratorTarget *target,cmake *cm)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  reference ppcVar4;
  cmSourceFileLocation *this;
  cmListFileBacktrace local_218;
  string local_1d8;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_1b8;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_1b0;
  const_iterator i;
  undefined1 local_198 [8];
  ostringstream e;
  cmake *cm_local;
  cmGeneratorTarget *target_local;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *badObjLib_local;
  
  bVar1 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::empty(badObjLib);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    poVar2 = std::operator<<((ostream *)local_198,"OBJECT library \"");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2,"\" contains:\n");
    local_1b0._M_current =
         (cmSourceFile **)
         std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin(badObjLib);
    while( true ) {
      local_1b8._M_current =
           (cmSourceFile **)
           std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end(badObjLib);
      bVar1 = __gnu_cxx::operator!=(&local_1b0,&local_1b8);
      if (!bVar1) break;
      poVar2 = std::operator<<((ostream *)local_198,"  ");
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                ::operator*(&local_1b0);
      this = cmSourceFile::GetLocation(*ppcVar4);
      psVar3 = cmSourceFileLocation::GetName_abi_cxx11_(this);
      poVar2 = std::operator<<(poVar2,(string *)psVar3);
      std::operator<<(poVar2,"\n");
      __gnu_cxx::
      __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
      ::operator++(&local_1b0);
    }
    std::operator<<((ostream *)local_198,
                    "but may contain only sources that compile, header files, and other files that would not affect linking of a normal library."
                   );
    std::__cxx11::ostringstream::str();
    cmGeneratorTarget::GetBacktrace(&local_218,target);
    cmake::IssueMessage(cm,FATAL_ERROR,&local_1d8,&local_218,false);
    cmListFileBacktrace::~cmListFileBacktrace(&local_218);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  }
  return;
}

Assistant:

void reportBadObjLib(std::vector<cmSourceFile*> const& badObjLib,
                     cmGeneratorTarget const* target, cmake *cm)
{
  if(!badObjLib.empty())
    {
    std::ostringstream e;
    e << "OBJECT library \"" << target->GetName() << "\" contains:\n";
    for(std::vector<cmSourceFile*>::const_iterator i = badObjLib.begin();
        i != badObjLib.end(); ++i)
      {
      e << "  " << (*i)->GetLocation().GetName() << "\n";
      }
    e << "but may contain only sources that compile, header files, and "
         "other files that would not affect linking of a normal library.";
    cm->IssueMessage(cmake::FATAL_ERROR, e.str(),
                     target->GetBacktrace());
    }
}